

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

void __thiscall
Vault::KeyValue::KeyValue(KeyValue *this,Client *client,SecretMount *mount,Version version)

{
  this->client_ = client;
  this->version_ = version;
  std::__cxx11::string::string((string *)&this->mount_,(string *)mount);
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client, Vault::SecretMount mount,
                          KeyValue::Version version)
    : client_(client)
    , version_(version)
    , mount_(std::move(mount)) {}